

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O3

void __thiscall t_xml_generator::iterate_program(t_xml_generator *this,t_program *program)

{
  pointer pcVar1;
  long lVar2;
  _func_int **pp_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  int iVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  t_xml_generator *this_00;
  _Alloc_hider _Var7;
  pointer pptVar8;
  pointer pptVar9;
  pointer pptVar10;
  pointer pptVar11;
  pointer pptVar12;
  pointer pptVar13;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  vector<t_program_*,_std::allocator<t_program_*>_> programs;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  string local_310;
  vector<t_program_*,_std::allocator<t_program_*>_> *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_2e0;
  _Rb_tree_node_base *local_2d8;
  vector<t_program_*,_std::allocator<t_program_*>_> local_2d0;
  vector<t_service_*,_std::allocator<t_service_*>_> local_2b8;
  vector<t_struct_*,_std::allocator<t_struct_*>_> local_2a0;
  vector<t_enum_*,_std::allocator<t_enum_*>_> local_288;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> local_270;
  vector<t_const_*,_std::allocator<t_const_*>_> local_258;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"document","");
  write_element_start(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"name","");
  pcVar1 = (program->name_)._M_dataplus._M_p;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + (program->name_)._M_string_length);
  this_00 = (t_xml_generator *)local_c0;
  write_attribute(this,(string *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (this->should_use_namespaces_ == true) {
    target_namespace_abi_cxx11_(&local_310,this_00,program);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"targetNamespace","");
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_310._M_dataplus._M_p,
               local_310._M_string_length + local_310._M_dataplus._M_p);
    write_attribute(this,&local_100,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "xmlns:",&program->name_);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_310._M_dataplus._M_p,
               local_310._M_string_length + local_310._M_dataplus._M_p);
    write_attribute(this,(string *)local_a0,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((_Base_ptr)local_a0._0_8_ != (_Base_ptr)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
  }
  local_2e8 = &program->name_;
  write_doc(this,&program->super_t_doc);
  local_2f0 = &program->includes_;
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)&local_310,local_2f0);
  if (local_310._M_dataplus._M_p != (pointer)local_310._M_string_length) {
    _Var7._M_p = local_310._M_dataplus._M_p;
    do {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"include","");
      write_element_start(this,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"name","");
      lVar2 = *(long *)(*(long *)_Var7._M_p + 0x50);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,lVar2,*(long *)(*(long *)_Var7._M_p + 0x58) + lVar2);
      write_attribute(this,&local_1a0,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      write_element_end(this);
      _Var7._M_p = _Var7._M_p + 8;
    } while (_Var7._M_p != (pointer)local_310._M_string_length);
  }
  p_Var5 = (program->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2d8 = &(program->namespaces_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_2d8) {
    local_2e0 = &program->namespace_annotations_;
    do {
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"namespace","");
      write_element_start(this,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"name","");
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      write_attribute(this,&local_220,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"value","");
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,*(long *)(p_Var5 + 2),
                 (long)&(p_Var5[2]._M_parent)->_M_color + *(long *)(p_Var5 + 2));
      write_attribute(this,&local_240,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      __x = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator[](local_2e0,(key_type *)(p_Var5 + 1))->_M_t;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_60,__x);
      generate_annotations
                (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      write_element_end(this);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_2d8);
  }
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_258,&program->consts_);
  __v = local_2e8;
  pptVar8 = local_258.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_258.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_258.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      generate_constant(this,*pptVar8);
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             local_258.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector(&local_270,&program->typedefs_);
  for (pptVar9 = local_270.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar9 !=
      local_270.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
    (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar9);
  }
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector(&local_288,&program->enums_);
  for (pptVar10 = local_288.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pptVar10 !=
      local_288.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
    (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar10);
  }
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector(&local_2a0,&program->objects_);
  for (pptVar11 = local_2a0.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pptVar11 !=
      local_2a0.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
    iVar4 = (*((*pptVar11)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
    pp_Var3 = (this->super_t_generator)._vptr_t_generator;
    if ((char)iVar4 == '\0') {
      (*pp_Var3[0x15])(this,*pptVar11);
    }
    else {
      (*pp_Var3[0x18])(this);
    }
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector(&local_2b8,&program->services_);
  for (pptVar12 = local_2b8.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pptVar12 !=
      local_2b8.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
    (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar12);
  }
  write_element_end(this);
  if (this->should_merge_includes_ == true) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->programs_,__v);
    std::vector<t_program_*,_std::allocator<t_program_*>_>::vector(&local_2d0,local_2f0);
    if (local_2d0.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_2d0.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pptVar13 = local_2d0.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(this->programs_)._M_t,&(*pptVar13)->name_);
        if ((_Rb_tree_header *)cVar6._M_node ==
            &(this->programs_)._M_t._M_impl.super__Rb_tree_header) {
          iterate_program(this,*pptVar13);
        }
        pptVar13 = pptVar13 + 1;
      } while (pptVar13 !=
               local_2d0.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_2d0.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d0.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_2b8.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a0.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_288.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_270.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((long *)local_310._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_xml_generator::iterate_program(t_program* program) {

  write_element_start("document");
  write_attribute("name", program->get_name());
  if (should_use_namespaces_) {
    const string targetNamespace = target_namespace(program);
    write_attribute("targetNamespace", targetNamespace);
    write_attribute("xmlns:" + program->get_name(), targetNamespace);
  }
  write_doc(program);

  const vector<t_program*> includes = program->get_includes();
  vector<t_program*>::const_iterator inc_it;
  for (inc_it = includes.begin(); inc_it != includes.end(); ++inc_it) {
    write_element_start("include");
    write_attribute("name", (*inc_it)->get_name());
    write_element_end();
  }

  const map<string, string>& namespaces = program->get_namespaces();
  map<string, string>::const_iterator ns_it;
  for (ns_it = namespaces.begin(); ns_it != namespaces.end(); ++ns_it) {
    write_element_start("namespace");
    write_attribute("name", ns_it->first);
    write_attribute("value", ns_it->second);
    generate_annotations(program->get_namespace_annotations(ns_it->first));
    write_element_end();
  }

  // TODO: can constants have annotations?
  vector<t_const*> consts = program->get_consts();
  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    generate_constant(*c_iter);
  }

  vector<t_typedef*> typedefs = program->get_typedefs();
  vector<t_typedef*>::iterator td_iter;
  for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
    generate_typedef(*td_iter);
  }

  vector<t_enum*> enums = program->get_enums();
  vector<t_enum*>::iterator en_iter;
  for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
    generate_enum(*en_iter);
  }

  vector<t_struct*> objects = program->get_objects();
  vector<t_struct*>::iterator o_iter;
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    if ((*o_iter)->is_xception()) {
      generate_xception(*o_iter);
    } else {
      generate_struct(*o_iter);
    }
  }

  vector<t_service*> services = program->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    generate_service(*sv_iter);
  }

  write_element_end();

  if (should_merge_includes_) {
    programs_.insert(program->get_name());
    const vector<t_program*> programs = program->get_includes();
    vector<t_program*>::const_iterator prog_it;
    for (prog_it = programs.begin(); prog_it != programs.end(); ++prog_it) {
      if (!programs_.count((*prog_it)->get_name())) {
        iterate_program(*prog_it);
      }
    }
  }

}